

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::copy_file(path *from,path *to,copy_options options,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  EnableBitmask<ghc::filesystem::copy_options> EVar4;
  perms X;
  EnableBitmask<ghc::filesystem::perms> EVar5;
  anon_class_4_1_3fcf65e3_for__M_tp __d;
  anon_class_4_1_ba1d6aae_for__M_tp __d_00;
  value_type *pvVar6;
  char *pcVar7;
  size_type __nbytes;
  ssize_t sVar8;
  error_code eVar9;
  undefined4 uStack_16c;
  long local_160;
  ssize_t offset;
  ssize_t bw;
  ssize_t br;
  undefined1 local_140 [8];
  shared_ptr<void> guard_out;
  int local_120;
  int mode;
  shared_ptr<void> guard_in;
  int out;
  int in;
  vector<char,_std::allocator<char>_> buffer;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c0;
  file_time_type to_time;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_a8;
  file_time_type from_time;
  file_status local_98;
  error_category *local_90;
  file_status local_80;
  file_status local_78;
  undefined4 local_70;
  file_status local_6c;
  byte local_61;
  bool overwrite;
  file_status st;
  file_status sf;
  error_code tect;
  error_code tecf;
  error_code *ec_local;
  copy_options options_local;
  path *to_local;
  path *from_local;
  
  std::error_code::error_code((error_code *)&tect._M_cat);
  std::error_code::error_code((error_code *)&sf);
  status((filesystem *)&st,from,(error_code *)&tect._M_cat);
  status((filesystem *)&stack0xffffffffffffffa0,to,(error_code *)&sf);
  local_61 = 0;
  std::error_code::clear(ec);
  file_status::file_status(&local_6c,&st);
  bVar2 = is_regular_file(&local_6c);
  file_status::~file_status(&local_6c);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    file_status::file_status(&local_78,(file_status *)&stack0xffffffffffffffa0);
    bVar3 = exists(&local_78);
    bVar1 = false;
    bVar2 = false;
    if (bVar3) {
      file_status::file_status(&local_80,(file_status *)&stack0xffffffffffffffa0);
      bVar1 = true;
      bVar3 = is_regular_file(&local_80);
      bVar2 = true;
      if (bVar3) {
        bVar3 = equivalent(from,to,ec);
        bVar2 = true;
        if (!bVar3) {
          EVar4 = operator|(skip_existing,overwrite_existing);
          EVar4 = operator|(EVar4,update_existing);
          EVar4 = operator&(options,EVar4);
          bVar2 = EVar4 == none;
        }
      }
    }
    if (bVar1) {
      file_status::~file_status(&local_80);
    }
    file_status::~file_status(&local_78);
    if (bVar2) {
      bVar2 = std::error_code::operator_cast_to_bool((error_code *)&sf);
      if (bVar2) {
        local_98 = sf;
        local_90 = (error_category *)tect._0_8_;
      }
      else {
        eVar9 = detail::make_error_code(exists);
        local_90 = eVar9._M_cat;
        local_98._type = eVar9._M_value;
      }
      ec->_M_value = local_98._type;
      *(perms *)&ec->field_0x4 = local_98._perms;
      *(undefined2 *)&ec->field_0x6 = local_98._6_2_;
      ec->_M_cat = local_90;
      from_local._7_1_ = false;
      local_70 = 1;
    }
    else {
      file_status::file_status((file_status *)&from_time,(file_status *)&stack0xffffffffffffffa0);
      bVar2 = exists((file_status *)&from_time);
      file_status::~file_status((file_status *)&from_time);
      if (bVar2) {
        EVar4 = operator&(options,update_existing);
        if (EVar4 == update_existing) {
          local_a8.__d.__r = (duration)last_write_time(from,ec);
          bVar2 = std::error_code::operator_cast_to_bool(ec);
          if (bVar2) {
            eVar9 = detail::make_system_error(0);
            to_time.__d.__r._0_4_ = eVar9._M_value;
            *(ulong *)ec = CONCAT44(to_time.__d.__r._4_4_,(int)to_time.__d.__r);
            ec->_M_cat = eVar9._M_cat;
            from_local._7_1_ = false;
            local_70 = 1;
            goto LAB_001a906f;
          }
          local_c0.__d.__r = (duration)last_write_time(to,ec);
          bVar2 = std::error_code::operator_cast_to_bool(ec);
          if (bVar2) {
            eVar9 = detail::make_system_error(0);
            buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = eVar9._M_value;
            *(ulong *)ec = CONCAT44(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    _20_4_,buffer.super__Vector_base<char,_std::allocator<char>_>.
                                           _M_impl._16_4_);
            ec->_M_cat = eVar9._M_cat;
            from_local._7_1_ = false;
            local_70 = 1;
            goto LAB_001a906f;
          }
          bVar2 = std::chrono::operator<=(&local_a8,&local_c0);
          if (bVar2) {
            from_local._7_1_ = false;
            local_70 = 1;
            goto LAB_001a906f;
          }
        }
        local_61 = 1;
      }
      out._3_1_ = 0;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&in,0x4000,(value_type *)((long)&out + 3),
                 (allocator_type *)((long)&out + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&out + 2));
      pvVar6 = path::c_str(from);
      __d.in = open(pvVar6,0);
      if (__d.in < 0) {
        eVar9 = detail::make_system_error(0);
        guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
             eVar9._M_value;
        *(ulong *)ec = CONCAT44(guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_,
                                (int)guard_in.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
        ec->_M_cat = eVar9._M_cat;
        from_local._7_1_ = false;
        local_70 = 1;
      }
      else {
        std::shared_ptr<void>::
        shared_ptr<ghc::filesystem::copy_file(ghc::filesystem::path_const&,ghc::filesystem::path_const&,ghc::filesystem::copy_options,std::error_code&)::__0>
                  ((shared_ptr<void> *)&mode,(nullptr_t)0x0,__d);
        local_120 = 0x241;
        if ((local_61 & 1) == 0) {
          local_120 = 0x2c1;
        }
        pvVar6 = path::c_str(to);
        X = file_status::permissions(&st);
        EVar5 = operator&(X,all);
        __d_00.out = open(pvVar6,local_120,(ulong)EVar5);
        if (__d_00.out < 0) {
          eVar9 = detail::make_system_error(0);
          guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
               eVar9._M_value;
          *(ulong *)ec = CONCAT44(guard_out.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi._4_4_,
                                  (int)guard_out.
                                       super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi);
          ec->_M_cat = eVar9._M_cat;
          from_local._7_1_ = false;
          local_70 = 1;
        }
        else {
          std::shared_ptr<void>::
          shared_ptr<ghc::filesystem::copy_file(ghc::filesystem::path_const&,ghc::filesystem::path_const&,ghc::filesystem::copy_options,std::error_code&)::__1>
                    ((shared_ptr<void> *)local_140,(nullptr_t)0x0,__d_00);
          while( true ) {
            pcVar7 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)&in);
            __nbytes = std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)&in);
            bw = read(__d.in,pcVar7,__nbytes);
            if (bw < 1) break;
            local_160 = 0;
            do {
              pcVar7 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)&in);
              sVar8 = write(__d_00.out,pcVar7 + local_160,bw);
              if (sVar8 < 1) {
                if (sVar8 < 0) {
                  eVar9 = detail::make_system_error(0);
                  *(ulong *)ec = CONCAT44(uStack_16c,eVar9._M_value);
                  ec->_M_cat = eVar9._M_cat;
                  from_local._7_1_ = false;
                  goto LAB_001a904b;
                }
              }
              else {
                bw = bw - sVar8;
                local_160 = sVar8 + local_160;
              }
            } while (bw != 0);
          }
          from_local._7_1_ = true;
LAB_001a904b:
          local_70 = 1;
          std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_140);
        }
        std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&mode);
      }
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&in);
    }
  }
  else {
    *(error_category **)ec = tect._M_cat;
    ec->_M_cat = (error_category *)tecf._0_8_;
    from_local._7_1_ = false;
    local_70 = 1;
  }
LAB_001a906f:
  file_status::~file_status((file_status *)&stack0xffffffffffffffa0);
  file_status::~file_status(&st);
  return from_local._7_1_;
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tecf, tect;
    auto sf = status(from, tecf);
    auto st = status(to, tect);
    bool overwrite = false;
    ec.clear();
    if (!is_regular_file(sf)) {
        ec = tecf;
        return false;
    }
    if (exists(st) && (!is_regular_file(st) || equivalent(from, to, ec) || (options & (copy_options::skip_existing | copy_options::overwrite_existing | copy_options::update_existing)) == copy_options::none)) {
        ec = tect ? tect : detail::make_error_code(detail::portable_error::exists);
        return false;
    }
    if (exists(st)) {
        if ((options & copy_options::update_existing) == copy_options::update_existing) {
            auto from_time = last_write_time(from, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            auto to_time = last_write_time(to, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            if (from_time <= to_time) {
                return false;
            }
        }
        overwrite = true;
    }
#ifdef GHC_OS_WINDOWS
    if (!::CopyFileW(detail::fromUtf8<std::wstring>(from.u8string()).c_str(), detail::fromUtf8<std::wstring>(to.u8string()).c_str(), !overwrite)) {
        ec = detail::make_system_error();
        return false;
    }
    return true;
#else
    std::vector<char> buffer(16384, '\0');
    int in = -1, out = -1;
    if ((in = ::open(from.c_str(), O_RDONLY)) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_in(nullptr, [in](void*) { ::close(in); });
    int mode = O_CREAT | O_WRONLY | O_TRUNC;
    if (!overwrite) {
        mode |= O_EXCL;
    }
    if ((out = ::open(to.c_str(), mode, static_cast<int>(sf.permissions() & perms::all))) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    std::shared_ptr<void> guard_out(nullptr, [out](void*) { ::close(out); });
    ssize_t br, bw;
    while ((br = ::read(in, buffer.data(), buffer.size())) > 0) {
        ssize_t offset = 0;
        do {
            if ((bw = ::write(out, buffer.data() + offset, static_cast<size_t>(br))) > 0) {
                br -= bw;
                offset += bw;
            }
            else if (bw < 0) {
                ec = detail::make_system_error();
                return false;
            }
        } while (br);
    }
    return true;
#endif
}